

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

JavascriptString *
Js::DateImplementation::GetDateDefaultString
          (YMD *pymd,TZD *ptzd,DateTimeFlag noDateTime,ScriptContext *scriptContext)

{
  ulong uVar1;
  CompoundString *this;
  char16 *s;
  YMD *pYVar2;
  int iVar3;
  undefined4 local_38;
  int positiveYear;
  
  this = CompoundString::NewWithCharCapacity
                   (0x48,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  if ((noDateTime._value & 2) == 0) {
    CompoundString::AppendChars<4u>(this,(char16 (*) [4])(g_rgpszDay + (long)pymd->wday * 8),true);
    CompoundString::AppendChars(this,L' ');
    CompoundString::AppendChars<4u>(this,(char16 (*) [4])(g_rgpszMonth + (long)pymd->mon * 8),true);
    CompoundString::AppendChars(this,L' ');
    local_38 = CONCAT22(local_38._2_2_,(short)pymd->mday + 1);
    CompoundString::
    AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
              (this);
    CompoundString::AppendChars(this,L' ');
    pYVar2 = pymd;
    if (pymd->year < 1) {
      local_38 = -pymd->year;
      CompoundString::AppendChars(this,L'-');
      pYVar2 = (YMD *)&local_38;
    }
    CompoundString::AppendChars<int,Js::__4>(this,pYVar2);
    if ((noDateTime._value & 1) != 0) {
      return (JavascriptString *)this;
    }
    CompoundString::AppendChars(this,L' ');
  }
  else if ((noDateTime._value & 1) != 0) {
    return (JavascriptString *)this;
  }
  local_38._0_2_ = (short)(pymd->time / 3600000);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (this,&local_38,(long)pymd->time % 3600000 & 0xffffffff);
  CompoundString::AppendChars(this,L':');
  uVar1 = (long)pymd->time / 60000;
  local_38._0_2_ =
       (undefined2)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (this,&local_38);
  CompoundString::AppendChars(this,L':');
  uVar1 = (long)pymd->time / 1000;
  local_38 = CONCAT22(local_38._2_2_,
                      (short)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                             % 0x3c));
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (this,&local_38);
  CompoundString::AppendChars<5u>(this,(char16 (*) [5])L" GMT",true);
  iVar3 = ptzd->offset;
  if (iVar3 < 0) {
    CompoundString::AppendChars(this,L'-');
    iVar3 = -iVar3;
  }
  else {
    CompoundString::AppendChars(this,L'+');
  }
  local_38._0_2_ = (short)(iVar3 / 0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (this,&local_38);
  local_38 = CONCAT22(local_38._2_2_,(short)(iVar3 % 0x3c));
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (this,&local_38);
  CompoundString::AppendChars<3u>(this,(char16 (*) [3])0xf1cfa4,true);
  if (ptzd->fDst == false) {
    s = PlatformAgnostic::DateTime::Utility::GetStandardName
                  (&scriptContext->dateTimeUtility,(size_t *)&local_38,pymd);
  }
  else {
    s = PlatformAgnostic::DateTime::Utility::GetDaylightName
                  (&scriptContext->dateTimeUtility,(size_t *)&local_38,pymd);
  }
  CompoundString::AppendChars(this,s,local_38);
  CompoundString::AppendChars(this,L')');
  return (JavascriptString *)this;
}

Assistant:

JavascriptString*
    DateImplementation::GetDateDefaultString(DateTime::YMD *pymd, TZD *ptzd,DateTimeFlag noDateTime,ScriptContext* scriptContext)
    {
        return GetDateDefaultString<CompoundString>(pymd, ptzd, noDateTime, scriptContext,
            [=](CharCount capacity) -> CompoundString*
        {
            return CompoundString::NewWithCharCapacity(capacity, scriptContext->GetLibrary());
        });
    }